

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

ostream * plot::ansi::detail::operator<<(ostream *stream,cursor_move *move)

{
  ostream *this;
  cursor_move *move_local;
  ostream *stream_local;
  
  this = std::operator<<(stream,"\x1b[");
  std::ostream::operator<<(this,move->count);
  stream_local = stream;
  switch(move->direction) {
  case up:
    stream_local = std::operator<<(stream,'A');
    break;
  case down:
    stream_local = std::operator<<(stream,'B');
    break;
  case forward:
    stream_local = std::operator<<(stream,'C');
    break;
  case backward:
    stream_local = std::operator<<(stream,'D');
  }
  return stream_local;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, cursor_move const& move) {
            stream << u8"\x1b[" << move.count;

            switch (move.direction) {
                case cursor_direction::up:
                    return stream << 'A';
                case cursor_direction::down:
                    return stream << 'B';
                case cursor_direction::forward:
                    return stream << 'C';
                case cursor_direction::backward:
                    return stream << 'D';
            }

            return stream;
        }